

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelNoClockSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
SimpleParallelSimulationDataGenerator::~SimpleParallelSimulationDataGenerator
          (SimpleParallelSimulationDataGenerator *this)

{
  SimpleParallelSimulationDataGenerator *this_local;
  
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector(&this->mDataMasks);
  std::vector<SimulationChannelDescriptor_*,_std::allocator<SimulationChannelDescriptor_*>_>::
  ~vector(&this->mData);
  SimulationChannelDescriptorGroup::~SimulationChannelDescriptorGroup(&this->mSimulationData);
  return;
}

Assistant:

SimpleParallelSimulationDataGenerator::~SimpleParallelSimulationDataGenerator()
{
}